

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::RestoreFindDefinitions(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  pointer ppVar3;
  char *value;
  OriginalDef *od;
  _Self local_18;
  iterator i;
  cmFindPackageCommand *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
       ::begin(&this->OriginalDefs);
  while( true ) {
    od = (OriginalDef *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
         ::end(&this->OriginalDefs);
    bVar2 = std::operator!=(&local_18,(_Self *)&od);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>
             ::operator->(&local_18);
    if (((ppVar3->second).exists & 1U) == 0) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>
               ::operator->(&local_18);
      cmMakefile::RemoveDefinition(pcVar1,&ppVar3->first);
    }
    else {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>
               ::operator->(&local_18);
      value = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&ppVar3->first,value);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void cmFindPackageCommand::RestoreFindDefinitions()
{
  for (std::map<std::string, OriginalDef>::iterator i =
         this->OriginalDefs.begin();
       i != this->OriginalDefs.end(); ++i) {
    OriginalDef const& od = i->second;
    if (od.exists) {
      this->Makefile->AddDefinition(i->first, od.value.c_str());
    } else {
      this->Makefile->RemoveDefinition(i->first);
    }
  }
}